

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_valence_decoder.h
# Opt level: O0

bool __thiscall
draco::MeshEdgebreakerTraversalValenceDecoder::Start
          (MeshEdgebreakerTraversalValenceDecoder *this,DecoderBuffer *out_buffer)

{
  bool bVar1;
  uint16_t uVar2;
  uint uVar3;
  DecoderBuffer *__src;
  ulong __new_size;
  size_type sVar4;
  uint32_t *puVar5;
  void *in_RSI;
  MeshEdgebreakerTraversalDecoder *in_RDI;
  uint32_t num_symbols;
  int i;
  int num_unique_valences;
  int8_t mode;
  uint32_t num_split_symbols;
  uint *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  MeshEdgebreakerTraversalDecoder *in_stack_ffffffffffffffa8;
  void *pvVar6;
  uint in_stack_ffffffffffffffb0;
  size_type in_stack_ffffffffffffffb8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_stack_ffffffffffffffc0;
  BitDecoder *this_00;
  uint local_30;
  int local_2c;
  char local_1d;
  uint local_1c;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  int num_components;
  
  uVar2 = MeshEdgebreakerTraversalDecoder::BitstreamVersion
                    ((MeshEdgebreakerTraversalDecoder *)0x1729dd);
  if ((0x201 < uVar2) ||
     (bVar1 = MeshEdgebreakerTraversalDecoder::DecodeTraversalSymbols(in_stack_ffffffffffffffa8),
     bVar1)) {
    bVar1 = MeshEdgebreakerTraversalDecoder::DecodeStartFaces(in_stack_ffffffffffffffa8);
    if (bVar1) {
      bVar1 = MeshEdgebreakerTraversalDecoder::DecodeAttributeSeams
                        ((MeshEdgebreakerTraversalDecoder *)
                         CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      if (bVar1) {
        __src = MeshEdgebreakerTraversalDecoder::buffer(in_RDI);
        memcpy(in_RSI,__src,0x34);
        uVar2 = MeshEdgebreakerTraversalDecoder::BitstreamVersion
                          ((MeshEdgebreakerTraversalDecoder *)0x172a57);
        if (uVar2 < 0x202) {
          uVar2 = MeshEdgebreakerTraversalDecoder::BitstreamVersion
                            ((MeshEdgebreakerTraversalDecoder *)0x172a6f);
          if (uVar2 < 0x200) {
            bVar1 = DecoderBuffer::Decode<unsigned_int>
                              (&in_stack_ffffffffffffffa8->buffer_,
                               (uint *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                              );
            if (!bVar1) {
              return false;
            }
          }
          else {
            bVar1 = DecodeVarint<unsigned_int>(in_stack_ffffffffffffff98,(DecoderBuffer *)0x172aa7);
            if (!bVar1) {
              return false;
            }
          }
          if ((uint)in_RDI[1].buffer_.data_size_ <= local_1c) {
            return false;
          }
          bVar1 = DecoderBuffer::Decode<signed_char>
                            (&in_stack_ffffffffffffffa8->buffer_,
                             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
          if (!bVar1) {
            return false;
          }
          if (local_1d != '\0') {
            return false;
          }
          in_RDI[1].buffer_.bit_mode_ = true;
          in_RDI[1].buffer_.field_0x31 = 0;
          in_RDI[1].buffer_.bitstream_version_ = 0;
          *(undefined4 *)&in_RDI[1].buffer_.field_0x34 = 7;
        }
        else {
          in_RDI[1].buffer_.bit_mode_ = true;
          in_RDI[1].buffer_.field_0x31 = 0;
          in_RDI[1].buffer_.bitstream_version_ = 0;
          *(undefined4 *)&in_RDI[1].buffer_.field_0x34 = 7;
        }
        if ((int)in_RDI[1].buffer_.data_size_ < 0) {
          bVar1 = false;
        }
        else {
          IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::resize
                    ((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>
                      *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (size_t)in_stack_ffffffffffffff98,(int *)0x172b79);
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::resize(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
          this_00 = &in_RDI[1].symbol_buffer_.bit_decoder_;
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::size((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)&in_RDI[1].symbol_buffer_);
          std::vector<int,_std::allocator<int>_>::resize
                    ((vector<int,_std::allocator<int>_> *)this_00,in_stack_ffffffffffffffb8);
          local_2c = 0;
          while( true ) {
            __new_size = (ulong)local_2c;
            sVar4 = std::
                    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ::size((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            *)&in_RDI[1].symbol_buffer_);
            if (sVar4 <= __new_size) break;
            bVar1 = DecodeVarint<unsigned_int>(in_stack_ffffffffffffff98,(DecoderBuffer *)0x172c11);
            if (!bVar1) {
              return false;
            }
            uVar3 = CornerTable::num_faces((CornerTable *)0x172c38);
            if (uVar3 < local_30) {
              return false;
            }
            if (local_30 != 0) {
              std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            *)&in_RDI[1].symbol_buffer_,(long)local_2c);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,__new_size);
              uVar3 = local_30;
              pvVar6 = in_RSI;
              std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            *)&in_RDI[1].symbol_buffer_,(long)local_2c);
              num_components = (int)((ulong)pvVar6 >> 0x20);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x172cab);
              DecodeSymbols(in_stack_ffffffffffffffb0,num_components,
                            (DecoderBuffer *)CONCAT44(uVar3,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff98);
              in_stack_ffffffffffffffb0 = local_30;
              puVar5 = (uint32_t *)
                       std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)
                                  &in_RDI[1].symbol_buffer_.bit_decoder_,(long)local_2c);
              *puVar5 = in_stack_ffffffffffffffb0;
            }
            local_2c = local_2c + 1;
          }
          bVar1 = true;
        }
      }
      else {
        bVar1 = false;
      }
    }
    else {
      bVar1 = false;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Start(DecoderBuffer *out_buffer) {
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
    if (BitstreamVersion() < DRACO_BITSTREAM_VERSION(2, 2)) {
      if (!MeshEdgebreakerTraversalDecoder::DecodeTraversalSymbols()) {
        return false;
      }
    }
#endif
    if (!MeshEdgebreakerTraversalDecoder::DecodeStartFaces()) {
      return false;
    }
    if (!MeshEdgebreakerTraversalDecoder::DecodeAttributeSeams()) {
      return false;
    }
    *out_buffer = *buffer();

#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
    if (BitstreamVersion() < DRACO_BITSTREAM_VERSION(2, 2)) {
      uint32_t num_split_symbols;
      if (BitstreamVersion() < DRACO_BITSTREAM_VERSION(2, 0)) {
        if (!out_buffer->Decode(&num_split_symbols)) {
          return false;
        }
      } else {
        if (!DecodeVarint(&num_split_symbols, out_buffer)) {
          return false;
        }
      }
      if (num_split_symbols >= static_cast<uint32_t>(num_vertices_)) {
        return false;
      }

      int8_t mode;
      if (!out_buffer->Decode(&mode)) {
        return false;
      }
      if (mode == EDGEBREAKER_VALENCE_MODE_2_7) {
        min_valence_ = 2;
        max_valence_ = 7;
      } else {
        // Unsupported mode.
        return false;
      }

    } else
#endif
    {
      min_valence_ = 2;
      max_valence_ = 7;
    }

    if (num_vertices_ < 0) {
      return false;
    }
    // Set the valences of all initial vertices to 0.
    vertex_valences_.resize(num_vertices_, 0);

    const int num_unique_valences = max_valence_ - min_valence_ + 1;

    // Decode all symbols for all contexts.
    context_symbols_.resize(num_unique_valences);
    context_counters_.resize(context_symbols_.size());
    for (int i = 0; i < context_symbols_.size(); ++i) {
      uint32_t num_symbols;
      if (!DecodeVarint<uint32_t>(&num_symbols, out_buffer)) {
        return false;
      }
      if (num_symbols > static_cast<uint32_t>(corner_table_->num_faces())) {
        return false;
      }
      if (num_symbols > 0) {
        context_symbols_[i].resize(num_symbols);
        DecodeSymbols(num_symbols, 1, out_buffer, context_symbols_[i].data());
        // All symbols are going to be processed from the back.
        context_counters_[i] = num_symbols;
      }
    }
    return true;
  }